

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O3

void golf_gi_deinit(golf_gi_t *gi)

{
  golf_gi_entity_t *pgVar1;
  golf_gi_entity_t *pgVar2;
  golf_gi_lightmap_section_t *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (0 < (gi->entities).length) {
    lVar6 = 0;
    do {
      pgVar2 = (gi->entities).data;
      pgVar1 = pgVar2 + lVar6;
      if (0 < pgVar2[lVar6].gi_lightmap_sections.length) {
        lVar4 = 0x80;
        lVar5 = 0;
        do {
          pgVar3 = (pgVar1->gi_lightmap_sections).data;
          golf_free_tracked(*(void **)((long)pgVar3 + lVar4 + -0x30));
          golf_free_tracked(*(void **)((long)pgVar3 + lVar4 + -0x18));
          golf_free_tracked(*(void **)((long)&(pgVar3->transform).position.x + lVar4));
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0xa8;
        } while (lVar5 < (pgVar1->gi_lightmap_sections).length);
      }
      golf_free_tracked((pgVar1->gi_lightmap_sections).data);
      golf_free_tracked((pgVar1->positions).data);
      golf_free_tracked((pgVar1->normals).data);
      golf_free_tracked((pgVar1->lightmap_uvs).data);
      golf_free_tracked((pgVar1->ignore).data);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (gi->entities).length);
  }
  golf_free_tracked((gi->entities).data);
  golf_thread_join(gi->thread);
  golf_thread_destroy(gi->thread);
  return;
}

Assistant:

void golf_gi_deinit(golf_gi_t *gi) {
    for (int i = 0; i < gi->entities.length; i++) {
        golf_gi_entity_t *entity = &gi->entities.data[i];
        for (int i = 0; i < entity->gi_lightmap_sections.length; i++) {
            golf_gi_lightmap_section_t *section = &entity->gi_lightmap_sections.data[i];
            vec_deinit(&section->positions);
            vec_deinit(&section->normals);
            vec_deinit(&section->lightmap_uvs);
        }
        vec_deinit(&entity->gi_lightmap_sections);
        vec_deinit(&entity->positions);
        vec_deinit(&entity->normals);
        vec_deinit(&entity->lightmap_uvs);
        vec_deinit(&entity->ignore);
    }
    vec_deinit(&gi->entities);
    golf_thread_join(gi->thread);
    golf_thread_destroy(gi->thread);
}